

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O3

void rmd160(void *key,int len,uint32_t seed,void *out)

{
  rmd160_init(&ltc_state);
  ltc_state.rmd128.state[0] = seed ^ 0x67452301;
  rmd160_process(&ltc_state,(uchar *)key,(long)len);
  rmd160_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void rmd160(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  rmd160_init(&ltc_state);
  ltc_state.rmd160.state[0] = 0x67452301UL ^ seed;
  rmd160_process(&ltc_state, (unsigned char *)key, len);
  rmd160_done(&ltc_state, (unsigned char *)out);
}